

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_ifelse::statement_ifelse
          (statement_ifelse *this,tree_type<cs::token_base_*> *tree,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *btrue,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *bfalse,context_t *c,
          token_base *ptr)

{
  context_t *in_RCX;
  undefined8 *in_RDI;
  token_base *in_R8;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_ffffffffffffff68;
  statement_base *this_00;
  statement_base local_40 [2];
  
  this_00 = local_40;
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_R8,
             (shared_ptr<cs::context_type> *)in_stack_ffffffffffffff68);
  statement_base::statement_base(this_00,in_RCX,in_R8);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x2574d4);
  *in_RDI = &PTR__statement_ifelse_003df448;
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)in_R8,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffff68);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_R8,
             in_stack_ffffffffffffff68);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_R8,
             in_stack_ffffffffffffff68);
  return;
}

Assistant:

statement_ifelse(tree_type<token_base *> tree, std::deque<statement_base *> btrue,
		                 std::deque<statement_base *> bfalse, context_t c, token_base *ptr) : statement_base(
			                     std::move(c),
			                     ptr),
			mTree(std::move(tree)),
			mBlock(std::move(btrue)),
			mElseBlock(std::move(
			               bfalse)) {}